

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacket.h
# Opt level: O3

void __thiscall
jrtplib::RTCPScheduler::AnalyseIncoming(RTCPScheduler *this,RTCPCompoundPacket *rtcpcomppack)

{
  size_t sVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  long lVar4;
  ulong uVar5;
  _List_node_base *p_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  
  p_Var6 = (rtcpcomppack->rtcppacklist).
           super__List_base<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  (rtcpcomppack->rtcppackit)._M_node = p_Var6;
  while (p_Var6 != (_List_node_base *)&rtcpcomppack->rtcppacklist) {
    p_Var2 = p_Var6->_M_next;
    p_Var3 = p_Var6[1]._M_next;
    (rtcpcomppack->rtcppackit)._M_node = p_Var2;
    if (p_Var3 == (_List_node_base *)0x0) break;
    p_Var6 = p_Var2;
    if (*(int *)((long)&p_Var3[1]._M_prev + 4) == 3) {
      if (this->byescheduled == true) {
        lVar4 = rtcpcomppack->compoundpacketlength + this->headeroverhead;
        auVar7._8_4_ = (int)((ulong)lVar4 >> 0x20);
        auVar7._0_8_ = lVar4;
        auVar7._12_4_ = 0x45300000;
        sVar1 = this->avgbyepacketsize;
        auVar8._8_4_ = (int)(sVar1 >> 0x20);
        auVar8._0_8_ = sVar1;
        auVar8._12_4_ = 0x45300000;
        dVar11 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) * 0.0625 +
                 ((auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 0.9375;
        uVar5 = (ulong)dVar11;
        this->avgbyepacketsize =
             (long)(dVar11 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5;
        this->byemembers = this->byemembers + 1;
      }
      return;
    }
  }
  lVar4 = rtcpcomppack->compoundpacketlength + this->headeroverhead;
  auVar9._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar9._0_8_ = lVar4;
  auVar9._12_4_ = 0x45300000;
  sVar1 = this->avgrtcppacksize;
  auVar10._8_4_ = (int)(sVar1 >> 0x20);
  auVar10._0_8_ = sVar1;
  auVar10._12_4_ = 0x45300000;
  dVar11 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) * 0.0625 +
           ((auVar10._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 0.9375;
  uVar5 = (ulong)dVar11;
  this->avgrtcppacksize = (long)(dVar11 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5;
  return;
}

Assistant:

void GotoFirstPacket()									{ rtcppackit = rtcppacklist.begin(); }